

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetKeyOwner(ImGuiKey key,ImGuiID owner_id,ImGuiInputFlags flags)

{
  uint uVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  
  pIVar2 = GImGui;
  if ((((key & ImGuiMod_Mask_) != ImGuiKey_KeysData_OFFSET) &&
      (uVar1 = key - ImGuiKey_ModCtrl >> 0xc, uVar3 = key << 0x14 | uVar1, uVar3 < 8)) &&
     ((0x8bU >> (uVar1 & 0x1f) & 1) != 0)) {
    key = *(ImGuiKey *)(&DAT_001f6930 + (ulong)uVar3 * 4);
  }
  iVar6 = key - ImGuiKey_NamedKey_BEGIN;
  GImGui->KeysOwnerData[iVar6].OwnerNext = owner_id;
  pIVar2->KeysOwnerData[iVar6].OwnerCurr = owner_id;
  bVar4 = (bool)((byte)((uint)flags >> 0x15) & 1);
  pIVar2->KeysOwnerData[iVar6].LockUntilRelease = bVar4;
  bVar5 = true;
  if (((uint)flags >> 0x14 & 1) == 0) {
    bVar5 = bVar4;
  }
  pIVar2->KeysOwnerData[iVar6].LockThisFrame = bVar5;
  return;
}

Assistant:

void ImGui::SetKeyOwner(ImGuiKey key, ImGuiID owner_id, ImGuiInputFlags flags)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(IsNamedKeyOrMod(key) && (owner_id != ImGuiKeyOwner_Any || (flags & (ImGuiInputFlags_LockThisFrame | ImGuiInputFlags_LockUntilRelease)))); // Can only use _Any with _LockXXX flags (to eat a key away without an ID to retrieve it)
    IM_ASSERT((flags & ~ImGuiInputFlags_SupportedBySetKeyOwner) == 0); // Passing flags not supported by this function!
    //IMGUI_DEBUG_LOG("SetKeyOwner(%s, owner_id=0x%08X, flags=%08X)\n", GetKeyName(key), owner_id, flags);

    ImGuiKeyOwnerData* owner_data = GetKeyOwnerData(&g, key);
    owner_data->OwnerCurr = owner_data->OwnerNext = owner_id;

    // We cannot lock by default as it would likely break lots of legacy code.
    // In the case of using LockUntilRelease while key is not down we still lock during the frame (no key_data->Down test)
    owner_data->LockUntilRelease = (flags & ImGuiInputFlags_LockUntilRelease) != 0;
    owner_data->LockThisFrame = (flags & ImGuiInputFlags_LockThisFrame) != 0 || (owner_data->LockUntilRelease);
}